

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall nodecpp::log::LogTransport::insertSingleMsg(LogTransport *this,char *msg,size_t sz)

{
  uint64_t *puVar1;
  LogBufferBaseData *pLVar2;
  size_t sVar3;
  size_t __n;
  size_t __n_00;
  uint8_t *__dest;
  ulong uVar4;
  
  pLVar2 = this->logData;
  if ((pLVar2->buffSize - pLVar2->end) + pLVar2->start < sz) {
    assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/src/log.cpp"
               ,0x111,"sz <= logData->availableSize()",true);
  }
  pLVar2 = this->logData;
  uVar4 = pLVar2->buffSize - 1 & pLVar2->end;
  __n = pLVar2->buffSize - uVar4;
  __dest = pLVar2->buff + uVar4;
  __n_00 = sz;
  if (__n < sz) {
    memcpy(__dest,msg,__n);
    __dest = this->logData->buff;
    sVar3 = this->logData->buffSize;
    msg = msg + (sVar3 - uVar4);
    __n_00 = (uVar4 + sz) - sVar3;
  }
  memcpy(__dest,msg,__n_00);
  puVar1 = &this->logData->end;
  *puVar1 = *puVar1 + sz;
  return;
}

Assistant:

void LogTransport::insertSingleMsg( const char* msg, size_t sz ) // under lock
	{
		NODECPP_ASSERT( foundation::module_id, ::nodecpp::assert::AssertLevel::critical, sz <= logData->availableSize() );
		size_t endoff = logData->end & (logData->buffSize - 1);
		if ( logData->buffSize - endoff >= sz )
		{
			memcpy( logData->buff + endoff, msg, sz );
		}
		else
		{
			memcpy( logData->buff + endoff, msg, logData->buffSize - endoff );
			memcpy( logData->buff, msg + logData->buffSize - endoff, sz - (logData->buffSize - endoff) );
		}
		logData->end += sz;
	}